

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_cc79b7::DirectoryObject::DumpInstallerPath
          (Value *__return_storage_ptr__,DirectoryObject *this,string *top,string *fromPathIn,
          string *toPath)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  Value *pVVar5;
  Value local_128;
  Value local_100;
  Value local_d8;
  Value local_b0;
  string_view local_88;
  string_view local_78;
  undefined1 local_58 [8];
  string fromPath;
  string *toPath_local;
  string *fromPathIn_local;
  string *top_local;
  DirectoryObject *this_local;
  Value *installPath;
  
  fromPath.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,nullValue);
  RelativeIfUnder((string *)local_58,top,fromPathIn);
  lVar2 = std::__cxx11::string::find_first_of((char)toPath,0x2f);
  if (lVar2 == -1) {
    local_78 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_88 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)toPath);
    bVar1 = cmHasSuffix(local_78,local_88);
    if (bVar1) {
      lVar2 = std::__cxx11::string::size();
      lVar3 = std::__cxx11::string::size();
      if (lVar2 != lVar3) {
        std::__cxx11::string::size();
        std::__cxx11::string::size();
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        if (*pcVar4 != '/') goto LAB_0066fb6c;
      }
      Json::Value::Value(&local_b0,(String *)local_58);
      Json::Value::operator=(__return_storage_ptr__,&local_b0);
      Json::Value::~Value(&local_b0);
      goto LAB_0066fc7c;
    }
  }
LAB_0066fb6c:
  Json::Value::Value(&local_d8,objectValue);
  Json::Value::operator=(__return_storage_ptr__,&local_d8);
  Json::Value::~Value(&local_d8);
  Json::Value::Value(&local_100,(String *)local_58);
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,"from");
  Json::Value::operator=(pVVar5,&local_100);
  Json::Value::~Value(&local_100);
  Json::Value::Value(&local_128,toPath);
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,"to");
  Json::Value::operator=(pVVar5,&local_128);
  Json::Value::~Value(&local_128);
LAB_0066fc7c:
  fromPath.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_58);
  if ((fromPath.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstallerPath(std::string const& top,
                                               std::string const& fromPathIn,
                                               std::string const& toPath)
{
  Json::Value installPath;

  std::string fromPath = RelativeIfUnder(top, fromPathIn);

  // If toPath is the last component of fromPath, use just fromPath.
  if (toPath.find_first_of('/') == std::string::npos &&
      cmHasSuffix(fromPath, toPath) &&
      (fromPath.size() == toPath.size() ||
       fromPath[fromPath.size() - toPath.size() - 1] == '/')) {
    installPath = fromPath;
  } else {
    installPath = Json::objectValue;
    installPath["from"] = fromPath;
    installPath["to"] = toPath;
  }

  return installPath;
}